

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Shader *shader,uint32_t indent,
          bool closing_brace)

{
  int iVar1;
  string *psVar2;
  bool bVar3;
  ostream *poVar4;
  value_type *this_00;
  value_type *this_01;
  value_type *this_02;
  value_type *this_03;
  value_type *this_04;
  value_type *this_05;
  value_type *this_06;
  value_type *this_07;
  value_type *this_08;
  value_type *this_09;
  value_type *this_10;
  value_type *this_11;
  uint uVar5;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint uVar6;
  undefined3 in_register_00000081;
  uint32_t indent_00;
  tinyusdz *ptVar7;
  pprint *this_12;
  stringstream ss;
  optional<tinyusdz::UsdTransform2d> pvtx2d;
  stringstream ss_1;
  optional<tinyusdz::ShaderNode> pvsn;
  optional<tinyusdz::UsdUVTexture> pvtex;
  optional<tinyusdz::UsdPrimvarReader<float>_> pvr;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> pvrp;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> pvrv;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> pvrn;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> pvr3;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> pvr2;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> pvr4;
  optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pvrs;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> pvrm;
  allocator aStack_12299;
  pprint *ppStack_12298;
  uint32_t uStack_1228c;
  string *psStack_12288;
  stringstream asStack_12280 [16];
  ostream aoStack_12270 [376];
  optional<tinyusdz::UsdTransform2d> oStack_120f8;
  undefined1 auStack_10d40 [12104];
  optional<tinyusdz::UsdPreviewSurface> local_ddf8;
  optional<tinyusdz::ShaderNode> local_aeb0;
  optional<tinyusdz::UsdUVTexture> local_a778;
  optional<tinyusdz::UsdPrimvarReader<float>_> local_8190;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> local_7348;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> local_64f8;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> local_56a8;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> local_4858;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> local_3a08;
  optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> local_2bb8;
  optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d60;
  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> local_ef8;
  
  indent_00 = CONCAT31(in_register_00000081,closing_brace);
  this_12 = (pprint *)((ulong)shader & 0xffffffff);
  uStack_1228c = indent;
  psStack_12288 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(asStack_12280);
  pprint::Indent_abi_cxx11_((string *)auStack_10d40,this_12,n);
  poVar4 = ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
  to_string_abi_cxx11_((string *)&local_ddf8,(tinyusdz *)(ulong)*(uint *)(this + 0x20),s);
  poVar4 = ::std::operator<<(poVar4,(string *)&local_ddf8);
  poVar4 = ::std::operator<<(poVar4," Shader \"");
  poVar4 = ::std::operator<<(poVar4,(string *)this);
  ::std::operator<<(poVar4,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0x30));
  iVar1 = (int)shader;
  n_02 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_((string *)auStack_10d40,(pprint *)((ulong)shader & 0xffffffff),n_00);
    poVar4 = ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
    ::std::operator<<(poVar4,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_
              ((string *)auStack_10d40,this + 0x30,(PrimMeta *)(ulong)(iVar1 + 1),indent);
    ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)auStack_10d40,(pprint *)((ulong)shader & 0xffffffff),n_01);
    poVar4 = ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
    ::std::operator<<(poVar4,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_((string *)auStack_10d40,(pprint *)((ulong)shader & 0xffffffff),n_02);
  poVar4 = ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
  ::std::operator<<(poVar4,"{\n");
  ::std::__cxx11::string::_M_dispose();
  if (*(long *)(this + 0x738) != 0) {
    pprint::Indent_abi_cxx11_((string *)auStack_10d40,(pprint *)(ulong)(iVar1 + 1),n_03);
    poVar4 = ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
    poVar4 = ::std::operator<<(poVar4,"uniform token info:id = \"");
    poVar4 = ::std::operator<<(poVar4,(string *)(this + 0x730));
    ::std::operator<<(poVar4,"\"\n");
    ::std::__cxx11::string::_M_dispose();
  }
  ptVar7 = this + 0x750;
  value::Value::get_value<tinyusdz::UsdPrimvarReader<float>>
            ((optional<tinyusdz::UsdPrimvarReader<float>_> *)auStack_10d40,(Value *)ptVar7,false);
  nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::
  optional<tinyusdz::UsdPrimvarReader<float>,_0>
            (&local_8190,(optional<tinyusdz::UsdPrimvarReader<float>_> *)auStack_10d40);
  nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::~optional
            ((optional<tinyusdz::UsdPrimvarReader<float>_> *)auStack_10d40);
  ppStack_12298 = this_12;
  if (local_8190.has_value_ == true) {
    this_00 = nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::value
                        (&local_8190);
    uVar6 = iVar1 + 1;
    ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
    poVar4 = (ostream *)(auStack_10d40 + 0x10);
    ::std::__cxx11::string::string
              ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
    print_str_attr((string *)&local_ddf8,&this_00->varname,(string *)&local_a778,uVar6);
    ::std::operator<<(poVar4,(string *)&local_ddf8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string
              ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
    print_typed_attr<float>((string *)&local_ddf8,&this_00->fallback,(string *)&local_a778,uVar6);
    ::std::operator<<(poVar4,(string *)&local_ddf8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string
              ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
    uVar5 = uVar6;
    print_typed_terminal_attr<float>
              ((string *)&local_ddf8,&this_00->result,(string *)&local_a778,uVar6);
    ::std::operator<<(poVar4,(string *)&local_ddf8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    print_common_shader_params_abi_cxx11_
              ((string *)&local_ddf8,(tinyusdz *)this_00,(ShaderNode *)(ulong)uVar6,uVar5);
    ::std::operator<<(poVar4,(string *)&local_ddf8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
    ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
              ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> *)auStack_10d40,
               (Value *)ptVar7,false);
    nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::
    optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>,_0>
              (&local_3a08,
               (optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> *)auStack_10d40);
    nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::~optional
              ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_> *)auStack_10d40);
    if (local_3a08.has_value_ == true) {
      this_01 = nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::value(&local_3a08);
      print_shader_params_abi_cxx11_
                ((string *)auStack_10d40,(tinyusdz *)this_01,
                 (UsdPrimvarReader_float2 *)(ulong)((uint32_t)ppStack_12298 + 1),
                 (uint32_t)ppStack_12298);
      ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> *)auStack_10d40,
                 (Value *)ptVar7,false);
      nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::
      optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>,_0>
                (&local_4858,
                 (optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> *)auStack_10d40);
      nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::
      ~optional((optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_> *)auStack_10d40);
      if (local_4858.has_value_ == true) {
        this_02 = nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::value(&local_4858)
        ;
        uVar6 = (int)ppStack_12298 + 1;
        ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
        poVar4 = (ostream *)(auStack_10d40 + 0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
        print_str_attr((string *)&local_ddf8,&this_02->varname,(string *)&local_a778,uVar6);
        ::std::operator<<(poVar4,(string *)&local_ddf8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::string
                  ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
        print_typed_attr<std::array<float,3ul>>
                  ((string *)&local_ddf8,(tinyusdz *)&this_02->fallback,
                   (TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)&local_a778,
                   (string *)(ulong)uVar6,indent_00);
        ::std::operator<<(poVar4,(string *)&local_ddf8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::string
                  ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
        uVar5 = uVar6;
        print_typed_terminal_attr<std::array<float,3ul>>
                  ((string *)&local_ddf8,(tinyusdz *)&this_02->result,
                   (TypedTerminalAttribute<std::array<float,_3UL>_> *)&local_a778,
                   (string *)(ulong)uVar6,indent_00);
        ::std::operator<<(poVar4,(string *)&local_ddf8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        print_common_shader_params_abi_cxx11_
                  ((string *)&local_ddf8,(tinyusdz *)this_02,(ShaderNode *)(ulong)uVar6,uVar5);
        ::std::operator<<(poVar4,(string *)&local_ddf8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
        ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        value::Value::get_value<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                  ((optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *)auStack_10d40,
                   (Value *)ptVar7,false);
        nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::
        optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>,_0>
                  (&local_2bb8,
                   (optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *)auStack_10d40);
        nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::
        ~optional((optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_> *)auStack_10d40);
        if (local_2bb8.has_value_ == true) {
          this_03 = nonstd::optional_lite::
                    optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::value
                              (&local_2bb8);
          uVar6 = (int)ppStack_12298 + 1;
          ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
          poVar4 = (ostream *)(auStack_10d40 + 0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
          print_str_attr((string *)&local_ddf8,&this_03->varname,(string *)&local_a778,uVar6);
          ::std::operator<<(poVar4,(string *)&local_ddf8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::string
                    ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
          print_typed_attr<std::array<float,4ul>>
                    ((string *)&local_ddf8,(tinyusdz *)&this_03->fallback,
                     (TypedAttribute<tinyusdz::Animatable<std::array<float,_4UL>_>_> *)&local_a778,
                     (string *)(ulong)uVar6,indent_00);
          ::std::operator<<(poVar4,(string *)&local_ddf8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::string
                    ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
          uVar5 = uVar6;
          print_typed_terminal_attr<std::array<float,4ul>>
                    ((string *)&local_ddf8,(tinyusdz *)&this_03->result,
                     (TypedTerminalAttribute<std::array<float,_4UL>_> *)&local_a778,
                     (string *)(ulong)uVar6,indent_00);
          ::std::operator<<(poVar4,(string *)&local_ddf8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          print_common_shader_params_abi_cxx11_
                    ((string *)&local_ddf8,(tinyusdz *)this_03,(ShaderNode *)(ulong)uVar6,uVar5);
          ::std::operator<<(poVar4,(string *)&local_ddf8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
          ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          value::Value::get_value<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                    ((optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_10d40,(Value *)ptVar7,false);
          nonstd::optional_lite::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                    (&local_1d60,
                     (optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_10d40);
          nonstd::optional_lite::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~optional((optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_10d40);
          if (local_1d60.has_value_ == true) {
            this_04 = nonstd::optional_lite::
                      optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::value(&local_1d60);
            uVar6 = (int)ppStack_12298 + 1;
            ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
            poVar4 = (ostream *)(auStack_10d40 + 0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
            print_str_attr((string *)&local_ddf8,&this_04->varname,(string *)&local_a778,uVar6);
            ::std::operator<<(poVar4,(string *)&local_ddf8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::string
                      ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
            print_typed_attr<std::__cxx11::string>
                      ((string *)&local_ddf8,(tinyusdz *)&this_04->fallback,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_a778,(string *)(ulong)uVar6,indent_00);
            ::std::operator<<(poVar4,(string *)&local_ddf8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::string
                      ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
            uVar5 = uVar6;
            print_typed_terminal_attr<std::__cxx11::string>
                      ((string *)&local_ddf8,(tinyusdz *)&this_04->result,
                       (TypedTerminalAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a778,(string *)(ulong)uVar6,indent_00);
            ::std::operator<<(poVar4,(string *)&local_ddf8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            print_common_shader_params_abi_cxx11_
                      ((string *)&local_ddf8,(tinyusdz *)this_04,(ShaderNode *)(ulong)uVar6,uVar5);
            ::std::operator<<(poVar4,(string *)&local_ddf8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
            ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                      ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> *)
                       auStack_10d40,(Value *)ptVar7,false);
            nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>
            ::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>,_0>
                      (&local_56a8,
                       (optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> *)
                       auStack_10d40);
            nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>
            ::~optional((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_> *)
                        auStack_10d40);
            if (local_56a8.has_value_ == true) {
              this_05 = nonstd::optional_lite::
                        optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>::value
                                  (&local_56a8);
              uVar6 = (int)ppStack_12298 + 1;
              ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
              poVar4 = (ostream *)(auStack_10d40 + 0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
              print_str_attr((string *)&local_ddf8,&this_05->varname,(string *)&local_a778,uVar6);
              ::std::operator<<(poVar4,(string *)&local_ddf8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::string
                        ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
              print_typed_attr<tinyusdz::value::normal3f>
                        ((string *)&local_ddf8,&this_05->fallback,(string *)&local_a778,uVar6);
              ::std::operator<<(poVar4,(string *)&local_ddf8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::string
                        ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
              uVar5 = uVar6;
              print_typed_terminal_attr<tinyusdz::value::normal3f>
                        ((string *)&local_ddf8,&this_05->result,(string *)&local_a778,uVar6);
              ::std::operator<<(poVar4,(string *)&local_ddf8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              print_common_shader_params_abi_cxx11_
                        ((string *)&local_ddf8,(tinyusdz *)this_05,(ShaderNode *)(ulong)uVar6,uVar5)
              ;
              ::std::operator<<(poVar4,(string *)&local_ddf8);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
              ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
              ::std::__cxx11::string::_M_dispose();
            }
            else {
              value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                        ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> *)
                         auStack_10d40,(Value *)ptVar7,false);
              nonstd::optional_lite::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>,_0>
                        (&local_64f8,
                         (optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> *)
                         auStack_10d40);
              nonstd::optional_lite::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::~optional
                        ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_> *)
                         auStack_10d40);
              if (local_64f8.has_value_ == true) {
                this_06 = nonstd::optional_lite::
                          optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::value
                                    (&local_64f8);
                uVar6 = (int)ppStack_12298 + 1;
                ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
                poVar4 = (ostream *)(auStack_10d40 + 0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
                print_str_attr((string *)&local_ddf8,&this_06->varname,(string *)&local_a778,uVar6);
                ::std::operator<<(poVar4,(string *)&local_ddf8);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::string
                          ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
                print_typed_attr<tinyusdz::value::vector3f>
                          ((string *)&local_ddf8,&this_06->fallback,(string *)&local_a778,uVar6);
                ::std::operator<<(poVar4,(string *)&local_ddf8);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::string
                          ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
                uVar5 = uVar6;
                print_typed_terminal_attr<tinyusdz::value::vector3f>
                          ((string *)&local_ddf8,&this_06->result,(string *)&local_a778,uVar6);
                ::std::operator<<(poVar4,(string *)&local_ddf8);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                print_common_shader_params_abi_cxx11_
                          ((string *)&local_ddf8,(tinyusdz *)this_06,(ShaderNode *)(ulong)uVar6,
                           uVar5);
                ::std::operator<<(poVar4,(string *)&local_ddf8);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
                ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                          ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> *)
                           auStack_10d40,(Value *)ptVar7,false);
                nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>,_0>
                          (&local_7348,
                           (optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> *)
                           auStack_10d40);
                nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::~optional
                          ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_> *)
                           auStack_10d40);
                if (local_7348.has_value_ == true) {
                  this_07 = nonstd::optional_lite::
                            optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::value
                                      (&local_7348);
                  uVar6 = (int)ppStack_12298 + 1;
                  ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
                  poVar4 = (ostream *)(auStack_10d40 + 0x10);
                  ::std::__cxx11::string::string
                            ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
                  print_str_attr((string *)&local_ddf8,&this_07->varname,(string *)&local_a778,uVar6
                                );
                  ::std::operator<<(poVar4,(string *)&local_ddf8);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::string
                            ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
                  print_typed_attr<tinyusdz::value::point3f>
                            ((string *)&local_ddf8,&this_07->fallback,(string *)&local_a778,uVar6);
                  ::std::operator<<(poVar4,(string *)&local_ddf8);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::string
                            ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
                  uVar5 = uVar6;
                  print_typed_terminal_attr<tinyusdz::value::point3f>
                            ((string *)&local_ddf8,&this_07->result,(string *)&local_a778,uVar6);
                  ::std::operator<<(poVar4,(string *)&local_ddf8);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  print_common_shader_params_abi_cxx11_
                            ((string *)&local_ddf8,(tinyusdz *)this_07,(ShaderNode *)(ulong)uVar6,
                             uVar5);
                  ::std::operator<<(poVar4,(string *)&local_ddf8);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
                  ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
                  ::std::__cxx11::string::_M_dispose();
                }
                else {
                  value::Value::get_value<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                            ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *)
                             auStack_10d40,(Value *)ptVar7,false);
                  nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>,_0>
                            (&local_ef8,
                             (optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *)
                             auStack_10d40);
                  nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::~optional
                            ((optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *)
                             auStack_10d40);
                  if (local_ef8.has_value_ == true) {
                    this_08 = nonstd::optional_lite::
                              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::
                              value(&local_ef8);
                    uVar6 = (int)ppStack_12298 + 1;
                    ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
                    poVar4 = (ostream *)(auStack_10d40 + 0x10);
                    ::std::__cxx11::string::string
                              ((string *)&local_a778,"inputs:varname",(allocator *)&oStack_120f8);
                    print_str_attr((string *)&local_ddf8,&this_08->varname,(string *)&local_a778,
                                   uVar6);
                    ::std::operator<<(poVar4,(string *)&local_ddf8);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::string
                              ((string *)&local_a778,"inputs:fallback",(allocator *)&oStack_120f8);
                    print_typed_attr<tinyusdz::value::matrix4d>
                              ((string *)&local_ddf8,&this_08->fallback,(string *)&local_a778,uVar6)
                    ;
                    ::std::operator<<(poVar4,(string *)&local_ddf8);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::string
                              ((string *)&local_a778,"outputs:result",(allocator *)&oStack_120f8);
                    uVar5 = uVar6;
                    print_typed_terminal_attr<tinyusdz::value::matrix4d>
                              ((string *)&local_ddf8,&this_08->result,(string *)&local_a778,uVar6);
                    ::std::operator<<(poVar4,(string *)&local_ddf8);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    print_common_shader_params_abi_cxx11_
                              ((string *)&local_ddf8,(tinyusdz *)this_08,(ShaderNode *)(ulong)uVar6,
                               uVar5);
                    ::std::operator<<(poVar4,(string *)&local_ddf8);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
                    ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
                    ::std::__cxx11::string::_M_dispose();
                  }
                  else {
                    value::Value::get_value<tinyusdz::UsdUVTexture>
                              ((optional<tinyusdz::UsdUVTexture> *)auStack_10d40,(Value *)ptVar7,
                               false);
                    nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::
                    optional<tinyusdz::UsdUVTexture,_0>
                              (&local_a778,(optional<tinyusdz::UsdUVTexture> *)auStack_10d40);
                    nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::~optional
                              ((optional<tinyusdz::UsdUVTexture> *)auStack_10d40);
                    if (local_a778.has_value_ == true) {
                      this_09 = nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::value
                                          (&local_a778);
                      print_shader_params_abi_cxx11_
                                ((string *)auStack_10d40,(tinyusdz *)this_09,
                                 (UsdUVTexture *)(ulong)((uint32_t)ppStack_12298 + 1),
                                 (uint32_t)ppStack_12298);
                      ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
                      ::std::__cxx11::string::_M_dispose();
                    }
                    else {
                      value::Value::get_value<tinyusdz::UsdTransform2d>
                                ((optional<tinyusdz::UsdTransform2d> *)auStack_10d40,(Value *)ptVar7
                                 ,false);
                      nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::
                      optional<tinyusdz::UsdTransform2d,_0>
                                (&oStack_120f8,(optional<tinyusdz::UsdTransform2d> *)auStack_10d40);
                      nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::~optional
                                ((optional<tinyusdz::UsdTransform2d> *)auStack_10d40);
                      if (oStack_120f8.has_value_ == true) {
                        this_10 = nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::value
                                            (&oStack_120f8);
                        uVar6 = (int)ppStack_12298 + 1;
                        ::std::__cxx11::stringstream::stringstream((stringstream *)auStack_10d40);
                        poVar4 = (ostream *)(auStack_10d40 + 0x10);
                        ::std::__cxx11::string::string
                                  ((string *)&local_aeb0,"inputs:in",&aStack_12299);
                        print_typed_attr<std::array<float,2ul>>
                                  ((string *)&local_ddf8,(tinyusdz *)&this_10->in,
                                   (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                    *)&local_aeb0,(string *)(ulong)uVar6,indent_00);
                        ::std::operator<<(poVar4,(string *)&local_ddf8);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::string
                                  ((string *)&local_aeb0,"inputs:rotation",&aStack_12299);
                        print_typed_attr<float>
                                  ((string *)&local_ddf8,&this_10->rotation,(string *)&local_aeb0,
                                   uVar6);
                        ::std::operator<<(poVar4,(string *)&local_ddf8);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::string
                                  ((string *)&local_aeb0,"inputs:scale",&aStack_12299);
                        print_typed_attr<std::array<float,2ul>>
                                  ((string *)&local_ddf8,(tinyusdz *)&this_10->scale,
                                   (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                    *)&local_aeb0,(string *)(ulong)uVar6,indent_00);
                        ::std::operator<<(poVar4,(string *)&local_ddf8);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::string
                                  ((string *)&local_aeb0,"inputs:translation",&aStack_12299);
                        print_typed_attr<std::array<float,2ul>>
                                  ((string *)&local_ddf8,(tinyusdz *)&this_10->translation,
                                   (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                    *)&local_aeb0,(string *)(ulong)uVar6,indent_00);
                        ::std::operator<<(poVar4,(string *)&local_ddf8);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::string
                                  ((string *)&local_aeb0,"outputs:result",&aStack_12299);
                        uVar5 = uVar6;
                        print_typed_terminal_attr<std::array<float,2ul>>
                                  ((string *)&local_ddf8,(tinyusdz *)&this_10->result,
                                   (TypedTerminalAttribute<std::array<float,_2UL>_> *)&local_aeb0,
                                   (string *)(ulong)uVar6,indent_00);
                        ::std::operator<<(poVar4,(string *)&local_ddf8);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        print_common_shader_params_abi_cxx11_
                                  ((string *)&local_ddf8,(tinyusdz *)this_10,
                                   (ShaderNode *)(ulong)uVar6,uVar5);
                        ::std::operator<<(poVar4,(string *)&local_ddf8);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::stringbuf::str();
                        ::std::__cxx11::stringstream::~stringstream((stringstream *)auStack_10d40);
                        ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
                        ::std::__cxx11::string::_M_dispose();
                      }
                      else {
                        value::Value::get_value<tinyusdz::UsdPreviewSurface>
                                  (&local_ddf8,(Value *)ptVar7,false);
                        nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::
                        optional<tinyusdz::UsdPreviewSurface,_0>
                                  ((optional<tinyusdz::UsdPreviewSurface> *)auStack_10d40,
                                   &local_ddf8);
                        nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::~optional
                                  (&local_ddf8);
                        if (auStack_10d40[0] == (stringstream)0x1) {
                          this_11 = nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::
                                    value((optional<tinyusdz::UsdPreviewSurface> *)auStack_10d40);
                          print_shader_params_abi_cxx11_
                                    ((string *)&local_ddf8,(tinyusdz *)this_11,
                                     (UsdPreviewSurface *)(ulong)((uint32_t)ppStack_12298 + 1),
                                     (uint32_t)ppStack_12298);
                          ::std::operator<<(aoStack_12270,(string *)&local_ddf8);
                          ::std::__cxx11::string::_M_dispose();
                        }
                        else {
                          value::Value::get_value<tinyusdz::ShaderNode>
                                    (&local_aeb0,(Value *)ptVar7,false);
                          nonstd::optional_lite::optional<tinyusdz::ShaderNode>::
                          optional<tinyusdz::ShaderNode,_0>
                                    ((optional<tinyusdz::ShaderNode> *)&local_ddf8,&local_aeb0);
                          nonstd::optional_lite::optional<tinyusdz::ShaderNode>::~optional
                                    (&local_aeb0);
                          if (local_ddf8.has_value_ == true) {
                            ptVar7 = (tinyusdz *)
                                     nonstd::optional_lite::optional<tinyusdz::ShaderNode>::value
                                               ((optional<tinyusdz::ShaderNode> *)&local_ddf8);
                            print_common_shader_params_abi_cxx11_
                                      ((string *)&local_aeb0,ptVar7,
                                       (ShaderNode *)(ulong)((uint32_t)ppStack_12298 + 1),
                                       (uint32_t)ppStack_12298);
                            ::std::operator<<(aoStack_12270,(string *)&local_aeb0);
                          }
                          else {
                            pprint::Indent_abi_cxx11_
                                      ((string *)&local_aeb0,
                                       (pprint *)(ulong)((int)ppStack_12298 + 1),n_04);
                            poVar4 = ::std::operator<<(aoStack_12270,(string *)&local_aeb0);
                            ::std::operator<<(poVar4,"[???] Invalid ShaderNode in Shader Prim\n");
                          }
                          ::std::__cxx11::string::_M_dispose();
                          nonstd::optional_lite::optional<tinyusdz::ShaderNode>::~optional
                                    ((optional<tinyusdz::ShaderNode> *)&local_ddf8);
                        }
                        nonstd::optional_lite::optional<tinyusdz::UsdPreviewSurface>::~optional
                                  ((optional<tinyusdz::UsdPreviewSurface> *)auStack_10d40);
                      }
                      nonstd::optional_lite::optional<tinyusdz::UsdTransform2d>::~optional
                                (&oStack_120f8);
                    }
                    nonstd::optional_lite::optional<tinyusdz::UsdUVTexture>::~optional(&local_a778);
                  }
                  nonstd::optional_lite::
                  optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_>::~optional
                            (&local_ef8);
                }
                nonstd::optional_lite::
                optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>_>::~optional
                          (&local_7348);
              }
              nonstd::optional_lite::
              optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>_>::~optional
                        (&local_64f8);
            }
            nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>_>
            ::~optional(&local_56a8);
          }
          nonstd::optional_lite::
          optional<tinyusdz::UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~optional(&local_1d60);
        }
        nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_4UL>_>_>::
        ~optional(&local_2bb8);
      }
      nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_3UL>_>_>::
      ~optional(&local_4858);
    }
    nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<std::array<float,_2UL>_>_>::~optional
              (&local_3a08);
  }
  nonstd::optional_lite::optional<tinyusdz::UsdPrimvarReader<float>_>::~optional(&local_8190);
  if ((char)uStack_1228c != '\0') {
    pprint::Indent_abi_cxx11_((string *)auStack_10d40,ppStack_12298,n_05);
    poVar4 = ::std::operator<<(aoStack_12270,(string *)auStack_10d40);
    ::std::operator<<(poVar4,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  psVar2 = psStack_12288;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(asStack_12280);
  return psVar2;
}

Assistant:

std::string to_string(const Shader &shader, const uint32_t indent,
                      bool closing_brace) {
  // generic Shader class
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(shader.spec) << " Shader \""
     << shader.name << "\"\n";
  if (shader.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(shader.metas(), indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  if (shader.info_id.size()) {
    ss << pprint::Indent(indent + 1) << "uniform token info:id = \""
       << shader.info_id << "\"\n";
  }

  if (auto pvr = shader.value.get_value<UsdPrimvarReader_float>()) {
    ss << print_shader_params(pvr.value(), indent + 1);
  } else if (auto pvr2 = shader.value.get_value<UsdPrimvarReader_float2>()) {
    ss << print_shader_params(pvr2.value(), indent + 1);
  } else if (auto pvr3 = shader.value.get_value<UsdPrimvarReader_float3>()) {
    ss << print_shader_params(pvr3.value(), indent + 1);
  } else if (auto pvr4 = shader.value.get_value<UsdPrimvarReader_float4>()) {
    ss << print_shader_params(pvr4.value(), indent + 1);
  } else if (auto pvrs = shader.value.get_value<UsdPrimvarReader_string>()) {
    ss << print_shader_params(pvrs.value(), indent + 1);
  } else if (auto pvrn = shader.value.get_value<UsdPrimvarReader_normal>()) {
    ss << print_shader_params(pvrn.value(), indent + 1);
  } else if (auto pvrv = shader.value.get_value<UsdPrimvarReader_vector>()) {
    ss << print_shader_params(pvrv.value(), indent + 1);
  } else if (auto pvrp = shader.value.get_value<UsdPrimvarReader_point>()) {
    ss << print_shader_params(pvrp.value(), indent + 1);
  } else if (auto pvrm = shader.value.get_value<UsdPrimvarReader_matrix>()) {
    ss << print_shader_params(pvrm.value(), indent + 1);
  } else if (auto pvtex = shader.value.get_value<UsdUVTexture>()) {
    ss << print_shader_params(pvtex.value(), indent + 1);
  } else if (auto pvtx2d = shader.value.get_value<UsdTransform2d>()) {
    ss << print_shader_params(pvtx2d.value(), indent + 1);
  } else if (auto pvs = shader.value.get_value<UsdPreviewSurface>()) {
    ss << print_shader_params(pvs.value(), indent + 1);
  } else if (auto pvsn = shader.value.get_value<ShaderNode>()) {
    // Generic ShaderNode
    ss << print_common_shader_params(pvsn.value(), indent + 1);
  } else {
    ss << pprint::Indent(indent + 1)
       << "[???] Invalid ShaderNode in Shader Prim\n";
  }

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}